

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsViewPrivate::_q_unsetViewportCursor(QGraphicsViewPrivate *this)

{
  QGraphicsView *this_00;
  QGraphicsItem *this_01;
  QWidget *this_02;
  QGraphicsItem **ppQVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  QPointF QVar5;
  QGraphicsItem local_60;
  QPoint local_50;
  QArrayDataPointer<QGraphicsItem_*> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsView **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  QVar5 = QSinglePointEvent::position((QSinglePointEvent *)&this->lastMouseEvent);
  local_60.d_ptr.d = (QGraphicsItemPrivate *)QVar5.yp;
  local_60._vptr_QGraphicsItem = (_func_int **)QVar5.xp;
  local_50 = QPointF::toPoint((QPointF *)&local_60);
  QGraphicsView::items((QList<QGraphicsItem_*> *)&local_48,this_00,&local_50);
  ppQVar1 = local_48.ptr;
  lVar4 = local_48.size << 3;
  lVar3 = 0;
  do {
    if (lVar4 == lVar3) {
      if (this->hasStoredOriginalCursor == true) {
        this->hasStoredOriginalCursor = false;
        this_02 = (this->super_QAbstractScrollAreaPrivate).viewport;
        if (this->dragMode == ScrollHandDrag) {
          QCursor::QCursor((QCursor *)&local_60,OpenHandCursor);
          QWidget::setCursor(this_02,(QCursor *)&local_60);
LAB_005ba9ec:
          QCursor::~QCursor((QCursor *)&local_60);
        }
        else {
          QWidget::setCursor(this_02,&this->originalCursor);
        }
      }
      QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return;
      }
      __stack_chk_fail();
    }
    this_01 = *(QGraphicsItem **)((long)ppQVar1 + lVar3);
    bVar2 = QGraphicsItem::isEnabled(this_01);
    if (bVar2) {
      bVar2 = QGraphicsItem::hasCursor(this_01);
      if (bVar2) {
        QGraphicsItem::cursor(&local_60);
        _q_setViewportCursor(this,(QCursor *)&local_60);
        goto LAB_005ba9ec;
      }
    }
    lVar3 = lVar3 + 8;
  } while( true );
}

Assistant:

void QGraphicsViewPrivate::_q_unsetViewportCursor()
{
    Q_Q(QGraphicsView);
    const auto items = q->items(lastMouseEvent->position().toPoint());
    for (QGraphicsItem *item : items) {
        if (item->isEnabled() && item->hasCursor()) {
            _q_setViewportCursor(item->cursor());
            return;
        }
    }

    // Restore the original viewport cursor.
    if (hasStoredOriginalCursor) {
        hasStoredOriginalCursor = false;
        if (dragMode == QGraphicsView::ScrollHandDrag)
            viewport->setCursor(Qt::OpenHandCursor);
        else
            viewport->setCursor(originalCursor);
    }
}